

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> * __thiscall
DistanceGraph::find_all_paths_between
          (vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
           *__return_storage_ptr__,DistanceGraph *this,sgNodeID_t from,sgNodeID_t to,
          int64_t max_size,int max_nodes,bool abort_on_loops)

{
  long *plVar1;
  int iVar2;
  pointer pNVar3;
  sgNodeID_t sVar4;
  bool bVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 uVar8;
  pointer this_00;
  _Vector_base<T,_std::allocator<T>_> *p_Var9;
  pointer pTVar10;
  pointer pTVar11;
  pointer pTVar12;
  ostream *poVar13;
  size_t __n;
  size_t __n_00;
  long lVar14;
  size_t __n_01;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *pvVar15;
  pointer pLVar16;
  SequenceDistanceGraph *__args;
  long lVar17;
  size_t __n_02;
  long lVar18;
  pointer pTVar19;
  Link *fl;
  pointer pTVar20;
  ulong uVar21;
  vector<T,_std::allocator<T>_> node_entries;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> final_paths;
  vector<Link,_std::allocator<Link>_> fwl;
  vector<long,_std::allocator<long>_> pp;
  vector<T,_std::allocator<T>_> local_e8;
  int local_cc;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> local_c8;
  ulong local_b0;
  ulong local_a8;
  sgNodeID_t local_a0;
  pointer local_98;
  _Vector_base<Link,_std::allocator<Link>_> local_90;
  _Vector_base<long,_std::allocator<long>_> local_78;
  sgNodeID_t local_58;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *local_50;
  size_type local_48;
  _Vector_base<T,_std::allocator<T>_> *local_40;
  int64_t local_38;
  
  local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8 = max_size;
  local_a0 = to;
  this_00 = (pointer)operator_new(3200000);
  local_50 = __return_storage_ptr__;
  std::_Vector_base<T,_std::allocator<T>_>::_M_deallocate
            ((_Vector_base<T,_std::allocator<T>_> *)0x0,(pointer)0x0,__n);
  pTVar20 = this_00 + 100000;
  local_c8.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data._M_start =
       this_00;
  local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data._M_finish =
       this_00;
  local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pTVar20;
  local_58 = from;
  get_fw_links((vector<Link,_std::allocator<Link>_> *)&local_90,this,from);
  local_98 = local_90._M_impl.super__Vector_impl_data._M_finish;
  pTVar19 = this_00;
  for (pLVar16 = local_90._M_impl.super__Vector_impl_data._M_start; pLVar16 != local_98;
      pLVar16 = pLVar16 + 1) {
    lVar17 = pLVar16->dest;
    pTVar10 = this_00;
    pTVar12 = pTVar19;
    if (lVar17 == local_a0) {
      __args = this->sdg;
      if (local_c8.
          super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_c8.
          super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_001c7d0d;
      std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
      emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                ((vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>> *)
                 &local_c8,__args,(vector<long,_std::allocator<long>_> *)&local_78);
    }
    else {
      __args = this->sdg;
LAB_001c7d0d:
      lVar14 = -lVar17;
      if (0 < lVar17) {
        lVar14 = lVar17;
      }
      pNVar3 = (__args->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar21 = pNVar3[lVar14].sequence._M_string_length;
      if (uVar21 <= local_a8) {
        if (pTVar19 == pTVar20) {
          p_Var9 = (_Vector_base<T,_std::allocator<T>_> *)
                   std::vector<T,_std::allocator<T>_>::_M_check_len
                             (&local_e8,(size_type)__args,(char *)pNVar3);
          pTVar10 = std::_Vector_base<T,_std::allocator<T>_>::_M_allocate(p_Var9,(size_t)__args);
          lVar17 = (long)pTVar19 - (long)this_00;
          sVar4 = pLVar16->dest;
          *(undefined8 *)((long)pTVar10 + lVar17) = 0xffffffffffffffff;
          *(sgNodeID_t *)((long)pTVar10 + lVar17 + 8) = sVar4;
          *(undefined4 *)((long)pTVar10 + lVar17 + 0x10) = 1;
          *(ulong *)((long)pTVar10 + lVar17 + 0x18) = uVar21;
          pTVar20 = pTVar10;
          for (pTVar11 = this_00; pTVar12 = pTVar20 + 1, pTVar11 != pTVar19; pTVar11 = pTVar11 + 1)
          {
            iVar6 = pTVar11->prev;
            sVar4 = pTVar11->node;
            uVar8 = *(undefined4 *)&pTVar11->field_0x14;
            iVar7 = pTVar11->partial_size;
            pTVar20->node_count = pTVar11->node_count;
            *(undefined4 *)&pTVar20->field_0x14 = uVar8;
            pTVar20->partial_size = iVar7;
            pTVar20->prev = iVar6;
            pTVar20->node = sVar4;
            pTVar20 = pTVar12;
          }
          std::_Vector_base<T,_std::allocator<T>_>::_M_deallocate
                    ((_Vector_base<T,_std::allocator<T>_> *)this_00,(pointer)(lVar17 >> 5),__n_00);
          pTVar20 = pTVar10 + (long)p_Var9;
          local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
          _M_start = pTVar10;
          local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
          _M_finish = pTVar12;
          local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = pTVar20;
        }
        else {
          pTVar19->prev = -1;
          pTVar19->node = lVar17;
          pTVar19->node_count = 1;
          pTVar19->partial_size = uVar21;
          pTVar12 = pTVar19 + 1;
          local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
          _M_finish = pTVar12;
        }
      }
    }
    this_00 = pTVar10;
    pTVar19 = pTVar12;
  }
  std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base(&local_90);
  uVar21 = 0;
  while( true ) {
    pvVar15 = local_50;
    lVar17 = (long)pTVar19 - (long)this_00;
    if ((((ulong)(lVar17 >> 5) <= uVar21) || (1000000 < (ulong)(lVar17 >> 5))) ||
       (0x7d1f < (ulong)((long)local_c8.
                               super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_c8.
                              super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                              ._M_impl.super__Vector_impl_data._M_start))) break;
    iVar2 = this_00[uVar21].node_count;
    local_38 = this_00[uVar21].partial_size;
    local_b0 = uVar21;
    get_fw_links((vector<Link,_std::allocator<Link>_> *)&local_90,this,this_00[uVar21].node);
    local_98 = local_90._M_impl.super__Vector_impl_data._M_finish;
    local_cc = iVar2 + 1;
    this_00 = local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
              _M_start;
    local_48 = (long)iVar2;
    for (pLVar16 = local_90._M_impl.super__Vector_impl_data._M_start; pLVar16 != local_98;
        pLVar16 = pLVar16 + 1) {
      lVar17 = pLVar16->dest;
      if (lVar17 == local_a0) {
        std::vector<long,_std::allocator<long>_>::resize
                  ((vector<long,_std::allocator<long>_> *)&local_78,local_48);
        pvVar15 = local_50;
        for (uVar21 = local_b0; uVar21 != 0xffffffffffffffff; uVar21 = this_00[uVar21].prev) {
          local_78._M_impl.super__Vector_impl_data._M_start[(long)this_00[uVar21].node_count + -1] =
               this_00[uVar21].node;
        }
        if (abort_on_loops) {
          lVar17 = (long)local_78._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78._M_impl.super__Vector_impl_data._M_start >> 3;
          for (lVar14 = 0; lVar14 != lVar17; lVar14 = lVar14 + 1) {
            lVar18 = 0;
            while (lVar17 != lVar18) {
              plVar1 = local_78._M_impl.super__Vector_impl_data._M_start + lVar18;
              lVar18 = lVar18 + 1;
              if (local_78._M_impl.super__Vector_impl_data._M_start[lVar14] == *plVar1) {
                (local_50->
                super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (local_50->
                super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (local_50->
                super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base(&local_90);
                goto LAB_001c80b0;
              }
            }
          }
        }
        std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
        emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                  ((vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>> *)
                   &local_c8,this->sdg,(vector<long,_std::allocator<long>_> *)&local_78);
      }
      else {
        bVar5 = max_nodes < (int)local_48;
        lVar14 = -lVar17;
        if (0 < lVar17) {
          lVar14 = lVar17;
        }
        pNVar3 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __n_02 = lVar14 * 0x38;
        uVar21 = pLVar16->dist + local_38 + pNVar3[lVar14].sequence._M_string_length;
        if (local_a8 >= uVar21 && !bVar5) {
          if (pTVar19 == pTVar20) {
            p_Var9 = (_Vector_base<T,_std::allocator<T>_> *)
                     std::vector<T,_std::allocator<T>_>::_M_check_len
                               (&local_e8,__n_02,
                                (char *)CONCAT71((int7)((ulong)pNVar3 >> 8),
                                                 local_a8 < uVar21 || bVar5));
            pTVar11 = std::_Vector_base<T,_std::allocator<T>_>::_M_allocate(p_Var9,__n_02);
            lVar17 = (long)pTVar20 - (long)this_00;
            sVar4 = pLVar16->dest;
            *(ulong *)((long)pTVar11 + lVar17) = local_b0;
            *(sgNodeID_t *)((long)pTVar11 + lVar17 + 8) = sVar4;
            *(int *)((long)pTVar11 + lVar17 + 0x10) = local_cc;
            *(ulong *)((long)pTVar11 + lVar17 + 0x18) = uVar21;
            pTVar10 = pTVar11;
            for (pTVar12 = this_00; pTVar19 = pTVar10 + 1, pTVar12 != pTVar20; pTVar12 = pTVar12 + 1
                ) {
              iVar6 = pTVar12->prev;
              sVar4 = pTVar12->node;
              uVar8 = *(undefined4 *)&pTVar12->field_0x14;
              iVar7 = pTVar12->partial_size;
              pTVar10->node_count = pTVar12->node_count;
              *(undefined4 *)&pTVar10->field_0x14 = uVar8;
              pTVar10->partial_size = iVar7;
              pTVar10->prev = iVar6;
              pTVar10->node = sVar4;
              pTVar10 = pTVar19;
            }
            local_40 = p_Var9;
            std::_Vector_base<T,_std::allocator<T>_>::_M_deallocate
                      ((_Vector_base<T,_std::allocator<T>_> *)this_00,(pointer)(lVar17 >> 5),__n_01)
            ;
            pTVar20 = pTVar11 + (long)local_40;
            this_00 = pTVar11;
            local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
            _M_start = pTVar11;
            local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
            _M_finish = pTVar19;
            local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = pTVar20;
          }
          else {
            pTVar19->prev = local_b0;
            pTVar19->node = lVar17;
            pTVar19->node_count = local_cc;
            pTVar19->partial_size = uVar21;
            pTVar19 = pTVar19 + 1;
            local_e8.super__Vector_base<T,_std::allocator<T>_>._M_impl.super__Vector_impl_data.
            _M_finish = pTVar19;
          }
        }
      }
    }
    std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base(&local_90);
    uVar21 = local_b0 + 1;
  }
  if (lVar17 == 32000000) {
    poVar13 = std::operator<<((ostream *)&std::cout,"From ");
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    poVar13 = std::operator<<(poVar13," to ");
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    poVar13 = std::operator<<(poVar13," with max_size ");
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    poVar13 = std::operator<<(poVar13," and max_nodes ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,max_nodes);
    poVar13 = std::operator<<(poVar13," there were too many nodes!");
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  if ((long)local_c8.
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_c8.
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            ._M_impl.super__Vector_impl_data._M_start == 32000) {
    poVar13 = std::operator<<((ostream *)&std::cout,"From ");
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    poVar13 = std::operator<<(poVar13," to ");
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    poVar13 = std::operator<<(poVar13," with max_size ");
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    poVar13 = std::operator<<(poVar13," and max_nodes ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,max_nodes);
    poVar13 = std::operator<<(poVar13," there were too many paths!");
    std::endl<char,std::char_traits<char>>(poVar13);
  }
  else if (lVar17 != 32000000) {
    (pvVar15->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_c8.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pvVar15->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_c8.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pvVar15->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_001c80b0;
  }
  (pvVar15->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar15->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar15->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001c80b0:
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_78);
  std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::~vector
            (&local_c8);
  std::vector<T,_std::allocator<T>_>::~vector(&local_e8);
  return pvVar15;
}

Assistant:

std::vector<SequenceDistanceGraphPath> DistanceGraph::find_all_paths_between(sgNodeID_t from,sgNodeID_t to, int64_t max_size, int max_nodes, bool abort_on_loops) const {
    typedef struct T {
        int64_t prev;
        sgNodeID_t node;
        int node_count;
        int64_t partial_size;
        T(uint64_t a, sgNodeID_t b, int c, int64_t d) : prev(a),node(b),node_count(c),partial_size(d){};
    } pathNodeEntry_t;

    std::vector<pathNodeEntry_t> node_entries;
    node_entries.reserve(100000);
    std::vector<SequenceDistanceGraphPath> final_paths;
    std::vector<sgNodeID_t> pp;

    for(auto &fl:get_fw_links(from)) {
        if (fl.dest==to and final_paths.empty()) {
            final_paths.emplace_back(sdg,pp);
        }
        else if (sdg.nodes[llabs(fl.dest)].sequence.size()<=max_size) {
            node_entries.emplace_back(-1, fl.dest, 1, sdg.nodes[llabs(fl.dest)].sequence.size());
        }
    }


    // XXX: This loop is growing forever on node 2083801 for backbone 58, the limits are heuristics to cap the complexity of regions captured
    for (uint64_t current_index=0;current_index<node_entries.size() and node_entries.size() < 1000001 and final_paths.size() < 1001;++current_index){
        auto current_entry=node_entries[current_index];
        auto fwl=get_fw_links(current_entry.node);
        for(auto &fl:fwl) {
            if (fl.dest==to){
                //reconstruct path backwards
                pp.resize(current_entry.node_count);

                for (uint64_t ei=current_index;ei!=-1;ei=node_entries[ei].prev){
                    pp[node_entries[ei].node_count-1]=node_entries[ei].node;
                }
                //check if there are any loops
                if (abort_on_loops) {
                    for (auto i1 = 0; i1 < pp.size(); ++i1) {
                        for (auto i2 = 0; i2 < pp.size(); ++i2) {
                            if (pp[i1]==pp[i2]) {
                                return {};
                            }
                        }
                    }
                }
                //add to solutions
                final_paths.emplace_back(sdg,pp);
            }
            else {
                uint64_t new_size=current_entry.partial_size+fl.dist+sdg.nodes[llabs(fl.dest)].sequence.size();
                if (new_size<=max_size and current_entry.node_count<=max_nodes) {
                    node_entries.emplace_back(current_index, fl.dest, current_entry.node_count+1, new_size);
                }
            }
        }

    }

    bool early_exit=false;
    if (node_entries.size() == 1000000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many nodes!"<< std::endl;
        early_exit = true;
    }

    if (final_paths.size() == 1000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many paths!"<< std::endl;
        early_exit = true;
    }

    if (early_exit) return {};
    return final_paths;
}